

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::SupportVectorClassifier::MergePartialFromCodedStream
          (SupportVectorClassifier *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  int iVar6;
  uint32 uVar7;
  Kernel *this_00;
  Type *this_01;
  StringVector *this_02;
  Int64Vector *this_03;
  SparseSupportVectors *this_04;
  DenseSupportVectors *this_05;
  pair<int,_int> pVar8;
  RepeatedField<double> *pRVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar12 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar11 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar11, (~(uint)*pbVar1 & uVar11) < 0x80))
        goto LAB_004c6d20;
        uVar12 = (ulong)((uVar11 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar12 = uVar12 | 0x100000000;
    }
    else {
LAB_004c6d20:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar12 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar7 | uVar12;
    }
    uVar7 = (uint32)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto LAB_004c6846;
    uVar11 = (uint)(uVar12 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar12;
    switch(uVar11) {
    case 1:
      if (cVar10 != '\n') goto LAB_004c6846;
      this_00 = this->kernel_;
      if (this_00 == (Kernel *)0x0) {
        this_00 = (Kernel *)operator_new(0x20);
        Kernel::Kernel(this_00);
        this->kernel_ = this_00;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar6 < 0) {
          return false;
        }
      }
      pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar6);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar5 = Kernel::MergePartialFromCodedStream(this_00,input);
      break;
    case 2:
      if (cVar10 == '\x10') {
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (1,0x12,input,&this->numberofsupportvectorsperclass_);
      }
      else {
        if ((uVar7 & 0xff) != 0x12) goto LAB_004c6846;
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,&this->numberofsupportvectorsperclass_);
      }
      goto LAB_004c6866;
    case 3:
      if (cVar10 != '\x1a') goto LAB_004c6846;
      if (this->_oneof_case_[0] == 3) {
        this_04 = (this->supportVectors_).sparsesupportvectors_;
      }
      else {
        clear_supportVectors(this);
        this->_oneof_case_[0] = 3;
        this_04 = (SparseSupportVectors *)operator_new(0x30);
        SparseSupportVectors::SparseSupportVectors(this_04);
        (this->supportVectors_).sparsesupportvectors_ = this_04;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar6 < 0) {
          return false;
        }
      }
      pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar6);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar5 = SparseSupportVectors::MergePartialFromCodedStream(this_04,input);
      break;
    case 4:
      if (cVar10 != '\"') goto LAB_004c6846;
      if (this->_oneof_case_[0] == 4) {
        this_05 = (this->supportVectors_).densesupportvectors_;
      }
      else {
        clear_supportVectors(this);
        this->_oneof_case_[0] = 4;
        this_05 = (DenseSupportVectors *)operator_new(0x30);
        DenseSupportVectors::DenseSupportVectors(this_05);
        (this->supportVectors_).densesupportvectors_ = this_05;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar6 < 0) {
          return false;
        }
      }
      pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar6);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar5 = DenseSupportVectors::MergePartialFromCodedStream(this_05,input);
      break;
    case 5:
      if (cVar10 != '*') goto LAB_004c6846;
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
                          (&(this->coefficients_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar6 < 0) {
          return false;
        }
      }
      pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar6);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar5 = Coefficients::MergePartialFromCodedStream(this_01,input);
      break;
    case 6:
      if (cVar10 == '1') {
        uVar7 = 0x32;
        pRVar9 = &this->rho_;
LAB_004c6a8d:
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (1,uVar7,input,pRVar9);
      }
      else {
        pRVar9 = &this->rho_;
        if ((uVar7 & 0xff) != 0x32) goto LAB_004c6846;
LAB_004c6a2e:
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input,pRVar9);
      }
      goto LAB_004c6866;
    case 7:
      if (cVar10 == '9') {
        uVar7 = 0x3a;
        pRVar9 = &this->proba_;
        goto LAB_004c6a8d;
      }
      pRVar9 = &this->proba_;
      if ((uVar7 & 0xff) == 0x3a) goto LAB_004c6a2e;
      goto LAB_004c6846;
    case 8:
      if (cVar10 == 'A') {
        uVar7 = 0x42;
        pRVar9 = &this->probb_;
        goto LAB_004c6a8d;
      }
      pRVar9 = &this->probb_;
      if ((uVar7 & 0xff) == 0x42) goto LAB_004c6a2e;
LAB_004c6846:
      if (uVar7 == 0) {
        return true;
      }
      if ((uVar7 & 7) == 4) {
        return true;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
      goto LAB_004c6866;
    default:
      if (uVar11 == 100) {
        if (cVar10 != '\"') goto LAB_004c6846;
        if (this->_oneof_case_[1] == 100) {
          this_02 = (this->ClassLabels_).stringclasslabels_;
        }
        else {
          clear_ClassLabels(this);
          this->_oneof_case_[1] = 100;
          this_02 = (StringVector *)operator_new(0x30);
          StringVector::StringVector(this_02);
          (this->ClassLabels_).stringclasslabels_ = this_02;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar8 < 0) {
          return false;
        }
        bVar5 = StringVector::MergePartialFromCodedStream(this_02,input);
      }
      else {
        if ((uVar11 != 0x65) || (cVar10 != '*')) goto LAB_004c6846;
        if (this->_oneof_case_[1] == 0x65) {
          this_03 = (this->ClassLabels_).int64classlabels_;
        }
        else {
          clear_ClassLabels(this);
          this->_oneof_case_[1] = 0x65;
          this_03 = (Int64Vector *)operator_new(0x28);
          Int64Vector::Int64Vector(this_03);
          (this->ClassLabels_).int64classlabels_ = this_03;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar8 < 0) {
          return false;
        }
        bVar5 = Int64Vector::MergePartialFromCodedStream(this_03,input);
      }
    }
    if (bVar5 == false) {
      return false;
    }
    bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                      (input,pVar8.first);
LAB_004c6866:
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool SupportVectorClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SupportVectorClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.Kernel kernel = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_kernel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 numberOfSupportVectorsPerClass = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_numberofsupportvectorsperclass())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(16u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 18u, input, this->mutable_numberofsupportvectorsperclass())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sparsesupportvectors()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_densesupportvectors()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.Coefficients coefficients = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_coefficients()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double rho = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_rho())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(49u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 50u, input, this->mutable_rho())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double probA = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_proba())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(57u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 58u, input, this->mutable_proba())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double probB = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_probb())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(65u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 66u, input, this->mutable_probb())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SupportVectorClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SupportVectorClassifier)
  return false;
#undef DO_
}